

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::GenerateCallProfiling
          (Lowerer *this,ProfileId profileId,InlineCacheIndex inlineCacheIndex,Opnd *retval,
          Opnd *calleeFunctionObjOpnd,Opnd *callInfo,bool returnTypeOnly,Instr *callInstr,
          Instr *insertAfter)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  IRType type;
  undefined4 *puVar3;
  Opnd *this_00;
  RegOpnd *pRVar4;
  Instr *pIVar5;
  HelperCallOpnd *newSrc;
  IntConstOpnd *pIVar6;
  JnHelperMethod local_a8;
  JnHelperMethod helperMethod;
  bool needInlineCacheIndex;
  Instr *profileCall;
  undefined1 local_88 [8];
  AutoReuseOpnd b;
  AutoReuseOpnd a;
  RegOpnd *saveOpnd;
  Opnd *starFlag;
  Func *func;
  bool returnTypeOnly_local;
  Opnd *callInfo_local;
  Opnd *calleeFunctionObjOpnd_local;
  Opnd *retval_local;
  InlineCacheIndex inlineCacheIndex_local;
  ProfileId profileId_local;
  Lowerer *this_local;
  
  bVar2 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1290,"(m_func->DoSimpleJitDynamicProfile())",
                       "m_func->DoSimpleJitDynamicProfile()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (callInstr->m_opcode != CALL) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1294,"(callInstr->m_opcode == Js::OpCode::CALL)",
                       "callInstr->m_opcode == Js::OpCode::CALL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  func_00 = insertAfter->m_func;
  this_00 = GetImplicitCallFlagsOpnd(this);
  type = IR::Opnd::GetType(this_00);
  pRVar4 = IR::RegOpnd::New(type,func_00);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&b.autoDelete,this_00,func_00,true);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_88,&pRVar4->super_Opnd,func_00,true);
  InsertMove(&pRVar4->super_Opnd,this_00,callInstr,true);
  InsertMove(this_00,&pRVar4->super_Opnd,insertAfter->m_next,true);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_88);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&b.autoDelete);
  calleeFunctionObjOpnd_local = retval;
  if (retval == (Opnd *)0x0) {
    if (returnTypeOnly) {
      return insertAfter;
    }
    calleeFunctionObjOpnd_local = &IR::AddrOpnd::NewNull(func_00)->super_Opnd;
  }
  pIVar5 = IR::Instr::New(Call,func_00);
  if (returnTypeOnly) {
    bVar2 = false;
    local_a8 = HelperSimpleProfileReturnTypeCall;
  }
  else {
    bVar2 = inlineCacheIndex != 0xffffffff;
    if (bVar2) {
      local_a8 = HelperSimpleProfileCall;
    }
    else {
      local_a8 = HelperSimpleProfileCall_DefaultInlineCacheIndex;
    }
  }
  newSrc = IR::HelperCallOpnd::New(local_a8,func_00);
  IR::Instr::SetSrc1(pIVar5,&newSrc->super_Opnd);
  IR::Instr::InsertAfter(insertAfter,pIVar5);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar5,callInfo);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar5,calleeFunctionObjOpnd);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar5,calleeFunctionObjOpnd_local);
  if (bVar2) {
    pIVar6 = IR::Opnd::CreateInlineCacheIndexOpnd(inlineCacheIndex,func_00);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar5,&pIVar6->super_Opnd);
  }
  pIVar6 = IR::Opnd::CreateProfileIdOpnd(profileId,func_00);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar5,&pIVar6->super_Opnd);
  pRVar4 = IR::Opnd::CreateFramePointerOpnd(func_00);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar5,&pRVar4->super_Opnd);
  pIVar5 = LowererMD::LowerCall(&this->m_lowererMD,pIVar5,0);
  return pIVar5;
}

Assistant:

IR::Instr*
Lowerer::GenerateCallProfiling(Js::ProfileId profileId, Js::InlineCacheIndex inlineCacheIndex, IR::Opnd* retval, IR::Opnd*calleeFunctionObjOpnd, IR::Opnd* callInfo, bool returnTypeOnly, IR::Instr*callInstr,IR::Instr*insertAfter)
{
    // This should only ever happen in profiling simplejit
    Assert(m_func->DoSimpleJitDynamicProfile());

    // Make sure they gave us the correct call instruction
#if defined(_M_IX86) || defined(_M_X64)
    Assert(callInstr->m_opcode == Js::OpCode::CALL);
#elif defined(_M_ARM)
    Assert(callInstr->m_opcode == Js::OpCode::BLX);
#elif defined(_M_ARM64)
    Assert(callInstr->m_opcode == Js::OpCode::BLR);
#endif
    Func*const func = insertAfter->m_func;

    {
        // First, we should save the implicit call flags
        const auto starFlag = GetImplicitCallFlagsOpnd();
        const auto saveOpnd = IR::RegOpnd::New(starFlag->GetType(), func);

        IR::AutoReuseOpnd a(starFlag, func), b(saveOpnd, func);
        //Save the flags (before call) and restore them (after the call)
        this->InsertMove(saveOpnd, starFlag, callInstr);
        // Note: On arm this is slightly inefficient because it forces a reload of the memory location to a reg (whereas x86 can load straight from hard-coded memory into a reg)
        //    But it works and making it not reload the memory location would force more refactoring.
        this->InsertMove(starFlag, saveOpnd, insertAfter->m_next);
    }

    // Profile a call that just happened: push some extra info on the stack and call the helper

    if (!retval)
    {
        if (returnTypeOnly)
        {
            // If we are only supposed to profile the return type but don't use the return value, we might
            // as well do nothing!
            return insertAfter;
        }
        retval = IR::AddrOpnd::NewNull(func);
    }

    IR::Instr* profileCall = IR::Instr::New(Js::OpCode::Call, func);

    bool needInlineCacheIndex;
    IR::JnHelperMethod helperMethod;
    if (returnTypeOnly)
    {
        needInlineCacheIndex = false;
        helperMethod = IR::HelperSimpleProfileReturnTypeCall;
    }
    else if(inlineCacheIndex == Js::Constants::NoInlineCacheIndex)
    {
        needInlineCacheIndex = false;
        helperMethod = IR::HelperSimpleProfileCall_DefaultInlineCacheIndex;
    }
    else
    {
        needInlineCacheIndex = true;
        helperMethod = IR::HelperSimpleProfileCall;
    }
    profileCall->SetSrc1(IR::HelperCallOpnd::New(helperMethod, func));

    insertAfter->InsertAfter(profileCall);

    m_lowererMD.LoadHelperArgument(profileCall, callInfo);
    m_lowererMD.LoadHelperArgument(profileCall, calleeFunctionObjOpnd);
    m_lowererMD.LoadHelperArgument(profileCall, retval);
    if(needInlineCacheIndex)
    {
        m_lowererMD.LoadHelperArgument(profileCall, IR::Opnd::CreateInlineCacheIndexOpnd(inlineCacheIndex, func));
    }
    m_lowererMD.LoadHelperArgument(profileCall, IR::Opnd::CreateProfileIdOpnd(profileId, func));
    // Push the frame pointer so that the profiling call can grab the stack layout
    m_lowererMD.LoadHelperArgument(profileCall, IR::Opnd::CreateFramePointerOpnd(func));

    // No args: the helper is stdcall
    return m_lowererMD.LowerCall(profileCall, 0);
}